

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O1

void qt_fusion_draw_mdibutton
               (QPainter *painter,QStyleOptionTitleBar *option,QRect *tmp,bool hover,bool sunken)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long *plVar14;
  long lVar15;
  undefined8 *puVar16;
  ColorGroup CVar17;
  QGradient *pQVar18;
  undefined7 in_register_00000081;
  long in_FS_OFFSET;
  byte bVar19;
  double dVar20;
  int iVar21;
  undefined1 auVar22 [16];
  QLinearGradient gradient;
  QPoint p;
  QLine lines [4];
  QBrush local_168 [8];
  QGradient local_160;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined4 local_e8;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined6 uStack_e0;
  undefined2 uStack_da;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined8 local_98;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  undefined8 uStack_80;
  int local_78;
  int iStack_74;
  int iStack_70;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  long local_38;
  
  bVar19 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = option->titleBarState;
  CVar17 = (int)option + 0x28;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  QPalette::brush(CVar17,Dark);
  iVar11 = QColor::hue();
  QPalette::brush(CVar17,Dark);
  iVar12 = QColor::saturation();
  if (0xfe < iVar12) {
    iVar12 = 0xff;
  }
  QPalette::brush(CVar17,Dark);
  iVar13 = QColor::value();
  iVar21 = (int)((double)iVar13 * 0.7);
  if (0xfe < (int)((double)iVar13 * 0.7)) {
    iVar21 = 0xff;
  }
  auVar22 = QColor::fromHsv(iVar11,iVar12,iVar21,0xff);
  local_a8 = auVar22._0_8_;
  puStack_a0._0_6_ = auVar22._8_6_;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  plVar14 = (long *)QPalette::brush(CVar17,Dark);
  local_b8 = *(undefined1 **)(*plVar14 + 8);
  puStack_b0 = *(undefined1 **)(*plVar14 + 0x10);
  local_c8 = 0xaaaaaaaa;
  uStack_c4 = 0xaaaaaaaa;
  uStack_c0 = 0xaaaaaaaa;
  uStack_bc = 0xaaaa;
  uStack_ba = 0xaaaa;
  if ((int)CONCAT71(in_register_00000081,sunken) == 0) {
    local_c8 = 1;
    uStack_c4 = 0xffff3c3c;
    uStack_c0 = 0xffffffff;
    uStack_bc = 0;
  }
  else {
    auVar22 = QColor::darker((int)&local_b8);
    local_c8 = auVar22._0_4_;
    uStack_c4 = auVar22._4_4_;
    uStack_c0 = auVar22._8_4_;
    uStack_bc = auVar22._12_2_;
  }
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  if ((uVar10 >> 0x10 & 1) == 0) {
    iVar11 = (int)&local_a8;
  }
  else {
    iVar11 = (int)&local_b8;
  }
  auVar22 = QColor::darker(iVar11);
  local_d8 = auVar22._0_8_;
  puStack_d0._0_6_ = auVar22._8_6_;
  if (sunken) {
    local_160.m_type = (tmp->x1).m_i + RadialGradient;
    local_160.m_spread = (tmp->y1).m_i + ReflectSpread;
    local_160.m_stops.d.d = (Data *)CONCAT44((tmp->y2).m_i + -1,(tmp->x2).m_i + -1);
    auVar22 = QColor::darker((int)&local_b8);
    local_78 = auVar22._0_4_;
    iStack_74 = auVar22._4_4_;
    iStack_70 = auVar22._8_4_;
    uStack_6c = auVar22._12_2_;
  }
  else {
    if (!hover) goto LAB_003c0a49;
    local_160.m_type = (tmp->x1).m_i + RadialGradient;
    local_160.m_spread = (tmp->y1).m_i + ReflectSpread;
    local_160.m_stops.d.d = (Data *)CONCAT44((tmp->y2).m_i + -1,(tmp->x2).m_i + -1);
    local_78 = 1;
    iStack_74 = 0xffff1414;
    iStack_70 = 0xffffffff;
    uStack_6c = 0;
  }
  QPainter::fillRect((QRect *)painter,(QColor *)&local_160);
LAB_003c0a49:
  uStack_da = 0xaaaa;
  local_e8 = 1;
  uStack_e4 = 0x2828;
  uStack_e2 = 0;
  uStack_e0 = 0;
  uStack_ea = 0xaaaa;
  local_f8 = 1;
  uStack_f4 = 0xffff3c3c;
  uStack_f0 = 0xffffffff;
  uStack_ec = 0;
  puVar16 = &DAT_006df150;
  pQVar18 = &local_160;
  for (lVar15 = 0xb; lVar15 != 0; lVar15 = lVar15 + -1) {
    uVar9 = *puVar16;
    pQVar18->m_type = (int)uVar9;
    pQVar18->m_spread = (int)((ulong)uVar9 >> 0x20);
    puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
    pQVar18 = (QGradient *)((long)pQVar18 + (ulong)bVar19 * -0x10 + 8);
  }
  lVar15 = (long)(tmp->x2).m_i + (long)(tmp->x1).m_i;
  dVar20 = (double)(int)((ulong)(lVar15 - (lVar15 >> 0x3f)) >> 1);
  QLinearGradient::QLinearGradient
            ((QLinearGradient *)&local_160,dVar20,(double)(tmp->y1).m_i,dVar20,(double)(tmp->y2).m_i
            );
  QGradient::setColorAt(0.0,(QColor *)&local_160);
  QGradient::setColorAt(1.0,(QColor *)&local_160);
  QPainter::setPen((QColor *)painter);
  iVar11 = (tmp->x1).m_i;
  iStack_74 = (tmp->y1).m_i;
  local_78 = iVar11 + 2;
  iVar12 = (tmp->x2).m_i;
  iStack_70 = iVar12 + -2;
  uStack_6c = (undefined2)iStack_74;
  uStack_6a = (undefined2)((uint)iStack_74 >> 0x10);
  iVar21 = (tmp->y2).m_i;
  _local_68 = CONCAT44(iVar21,local_78);
  _iStack_60 = CONCAT44(iVar21,iStack_70);
  _local_58 = CONCAT44(iStack_74 + 2,iVar11);
  _iStack_50 = CONCAT44(iVar21 + -2,iVar11);
  _local_48 = CONCAT44(iStack_74 + 2,iVar12);
  _iStack_40 = CONCAT44(iVar21 + -2,iVar12);
  QPainter::drawLines((QLine *)painter,(int)&local_78);
  iVar11 = (tmp->x1).m_i + 1;
  iVar12 = (tmp->y1).m_i + 1;
  local_98 = CONCAT44(iVar12,iVar11);
  iVar21 = (tmp->x2).m_i + -1;
  iVar13 = (tmp->y2).m_i + -1;
  _iStack_90 = CONCAT44(iVar12,iVar21);
  _local_88 = CONCAT44(iVar13,iVar11);
  uStack_80 = CONCAT44(iVar13,iVar21);
  QPainter::drawPoints((QPoint *)painter,(int)&local_98);
  QPainter::setPen((QColor *)painter);
  uVar1 = tmp->y1;
  uVar5 = tmp->x2;
  local_108 = (tmp->x1).m_i + 2;
  iStack_104 = uVar1 + 1;
  iStack_100 = uVar5 + -2;
  iStack_fc = uVar1 + 1;
  QPainter::drawLines((QLine *)painter,(int)&local_108);
  uVar2 = tmp->x1;
  uVar6 = tmp->y1;
  local_108 = uVar2 + 1;
  iStack_104 = uVar6 + 2;
  iStack_fc = (tmp->y2).m_i + -2;
  iStack_100 = local_108;
  QPainter::drawLines((QLine *)painter,(int)&local_108);
  QBrush::QBrush(local_168,&local_160);
  QPen::QPen((QPen *)&local_108,local_168,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)painter);
  QPen::~QPen((QPen *)&local_108);
  QBrush::~QBrush(local_168);
  iStack_fc = (tmp->y2).m_i + -2;
  uVar3 = tmp->y1;
  uVar7 = tmp->x2;
  iStack_104 = uVar3 + 2;
  local_108 = uVar7 + 1;
  iStack_100 = local_108;
  QPainter::drawLines((QLine *)painter,(int)&local_108);
  local_108 = (tmp->x2).m_i;
  iStack_104 = (tmp->y1).m_i + 1;
  QPainter::drawPoints((QPoint *)painter,(int)&local_108);
  local_108 = (tmp->x1).m_i + 2;
  uVar4 = tmp->x2;
  uVar8 = tmp->y2;
  iStack_100 = uVar4 + -2;
  iStack_104 = uVar8 + 1;
  iStack_fc = iStack_104;
  QPainter::drawLines((QLine *)painter,(int)&local_108);
  iStack_104 = (tmp->y2).m_i;
  local_108 = (tmp->x1).m_i + 1;
  QPainter::drawPoints((QPoint *)painter,(int)&local_108);
  iStack_104 = (tmp->y2).m_i;
  local_108 = (tmp->x2).m_i + -1;
  QPainter::drawPoints((QPoint *)painter,(int)&local_108);
  local_108 = (tmp->x2).m_i;
  iStack_104 = (tmp->y2).m_i + -1;
  QPainter::drawPoints((QPoint *)painter,(int)&local_108);
  QLinearGradient::~QLinearGradient((QLinearGradient *)&local_160);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_fusion_draw_mdibutton(QPainter *painter, const QStyleOptionTitleBar *option, const QRect &tmp, bool hover, bool sunken)
{
    bool active = (option->titleBarState & QStyle::State_Active);
    const QColor dark = QColor::fromHsv(option->palette.button().color().hue(),
                                        qMin(255, option->palette.button().color().saturation()),
                                        qMin(255, int(option->palette.button().color().value() * 0.7)));
    const QColor highlight = option->palette.highlight().color();
    const QColor titleBarHighlight(sunken ? highlight.darker(130) : QColor(255, 255, 255, 60));
    const QColor mdiButtonBorderColor(active ? highlight.darker(180): dark.darker(110));

    if (sunken)
        painter->fillRect(tmp.adjusted(1, 1, -1, -1), highlight.darker(120));
    else if (hover)
        painter->fillRect(tmp.adjusted(1, 1, -1, -1), QColor(255, 255, 255, 20));

    const QColor mdiButtonGradientStartColor(0, 0, 0, 40);
    const QColor mdiButtonGradientStopColor(255, 255, 255, 60);

    QLinearGradient gradient(tmp.center().x(), tmp.top(), tmp.center().x(), tmp.bottom());
    gradient.setColorAt(0, mdiButtonGradientStartColor);
    gradient.setColorAt(1, mdiButtonGradientStopColor);

    painter->setPen(mdiButtonBorderColor);
    const QLine lines[4] = {
        QLine(tmp.left() + 2, tmp.top(), tmp.right() - 2, tmp.top()),
        QLine(tmp.left() + 2, tmp.bottom(), tmp.right() - 2, tmp.bottom()),
        QLine(tmp.left(), tmp.top() + 2, tmp.left(), tmp.bottom() - 2),
        QLine(tmp.right(), tmp.top() + 2, tmp.right(), tmp.bottom() - 2)
    };
    painter->drawLines(lines, 4);
    const QPoint points[4] = {
        QPoint(tmp.left() + 1, tmp.top() + 1),
        QPoint(tmp.right() - 1, tmp.top() + 1),
        QPoint(tmp.left() + 1, tmp.bottom() - 1),
        QPoint(tmp.right() - 1, tmp.bottom() - 1)
    };
    painter->drawPoints(points, 4);

    painter->setPen(titleBarHighlight);
    painter->drawLine(tmp.left() + 2, tmp.top() + 1, tmp.right() - 2, tmp.top() + 1);
    painter->drawLine(tmp.left() + 1, tmp.top() + 2, tmp.left() + 1, tmp.bottom() - 2);

    painter->setPen(QPen(gradient, 1));
    painter->drawLine(tmp.right() + 1, tmp.top() + 2, tmp.right() + 1, tmp.bottom() - 2);
    painter->drawPoint(tmp.right() , tmp.top() + 1);

    painter->drawLine(tmp.left() + 2, tmp.bottom() + 1, tmp.right() - 2, tmp.bottom() + 1);
    painter->drawPoint(tmp.left() + 1, tmp.bottom());
    painter->drawPoint(tmp.right() - 1, tmp.bottom());
    painter->drawPoint(tmp.right() , tmp.bottom() - 1);
}